

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void downgradeAllSharedCacheTableLocks(Btree *p)

{
  BtShared *pBVar1;
  BtLock *local_20;
  BtLock *pLock;
  BtShared *pBt;
  Btree *p_local;
  
  pBVar1 = p->pBt;
  if (pBVar1->pWriter == p) {
    pBVar1->pWriter = (Btree *)0x0;
    pBVar1->btsFlags = pBVar1->btsFlags & 0xff3f;
    for (local_20 = pBVar1->pLock; local_20 != (BtLock *)0x0; local_20 = local_20->pNext) {
      local_20->eLock = '\x01';
    }
  }
  return;
}

Assistant:

static void downgradeAllSharedCacheTableLocks(Btree *p){
  BtShared *pBt = p->pBt;
  if( pBt->pWriter==p ){
    BtLock *pLock;
    pBt->pWriter = 0;
    pBt->btsFlags &= ~(BTS_EXCLUSIVE|BTS_PENDING);
    for(pLock=pBt->pLock; pLock; pLock=pLock->pNext){
      assert( pLock->eLock==READ_LOCK || pLock->pBtree==p );
      pLock->eLock = READ_LOCK;
    }
  }
}